

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Continent::~Continent(Continent *this)

{
  string *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  Continent *this_local;
  
  this_00 = this->pCName;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  if (this->pCTroops != (int *)0x0) {
    operator_delete(this->pCTroops,4);
  }
  this_01 = this->pCountriesInContinent;
  if (this_01 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector(this_01);
    operator_delete(this_01,0x18);
  }
  return;
}

Assistant:

Map::Continent::~Continent() {
    delete pCName;
    delete pCTroops;
    delete pCountriesInContinent;
}